

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O2

WebPMuxError MuxGetCanvasInfo(WebPMux *mux,int *width,int *height,uint32_t *flags)

{
  WebPMuxImage *wpi_list;
  WebPMuxError WVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  WebPMuxError WVar6;
  int iVar7;
  WebPData data;
  
  WVar1 = MuxGet(mux,IDX_VP8X,(uint32_t)&data,(WebPData *)flags);
  WVar6 = WEBP_MUX_BAD_DATA;
  if (WVar1 != WEBP_MUX_NOT_FOUND) {
    if (data.size < 10) {
      return WEBP_MUX_BAD_DATA;
    }
    uVar4 = *(uint32_t *)data.bytes;
    iVar7 = (uint)data.bytes[6] * 0x10000 + (uint)*(ushort *)(data.bytes + 4) + 1;
    iVar5 = (uint)data.bytes[9] * 0x10000 + (uint)*(ushort *)(data.bytes + 7) + 1;
    goto LAB_001065ee;
  }
  wpi_list = mux->images_;
  iVar7 = mux->canvas_width_;
  iVar5 = mux->canvas_height_;
  if (mux->canvas_height_ == 0 && iVar7 == 0) {
    iVar2 = MuxImageCount(wpi_list,WEBP_CHUNK_IMAGE);
    iVar3 = MuxImageCount(mux->images_,WEBP_CHUNK_ANMF);
    iVar5 = 0;
    if ((iVar2 != 1) || (iVar5 = 0, iVar3 != 0)) goto LAB_001065d2;
    iVar7 = wpi_list->width_;
    iVar5 = wpi_list->height_;
  }
  else {
LAB_001065d2:
    if (wpi_list == (WebPMuxImage *)0x0) {
      uVar4 = 0;
      goto LAB_001065ee;
    }
  }
  uVar4 = (uint)(wpi_list->has_alpha_ != 0) << 4;
LAB_001065ee:
  if ((ulong)((long)iVar5 * (long)iVar7) >> 0x20 == 0) {
    if (width != (int *)0x0) {
      *width = iVar7;
    }
    if (height != (int *)0x0) {
      *height = iVar5;
    }
    WVar6 = WEBP_MUX_OK;
    if (flags != (uint32_t *)0x0) {
      *flags = uVar4;
    }
  }
  return WVar6;
}

Assistant:

static WebPMuxError MuxGetCanvasInfo(const WebPMux* const mux,
                                     int* width, int* height, uint32_t* flags) {
  int w, h;
  uint32_t f = 0;
  WebPData data;
  assert(mux != NULL);

  // Check if VP8X chunk is present.
  if (MuxGet(mux, IDX_VP8X, 1, &data) == WEBP_MUX_OK) {
    if (data.size < VP8X_CHUNK_SIZE) return WEBP_MUX_BAD_DATA;
    f = GetLE32(data.bytes + 0);
    w = GetLE24(data.bytes + 4) + 1;
    h = GetLE24(data.bytes + 7) + 1;
  } else {
    const WebPMuxImage* const wpi = mux->images_;
    // Grab user-forced canvas size as default.
    w = mux->canvas_width_;
    h = mux->canvas_height_;
    if (w == 0 && h == 0 && ValidateForSingleImage(mux) == WEBP_MUX_OK) {
      // single image and not forced canvas size => use dimension of first frame
      assert(wpi != NULL);
      w = wpi->width_;
      h = wpi->height_;
    }
    if (wpi != NULL) {
      if (wpi->has_alpha_) f |= ALPHA_FLAG;
    }
  }
  if (w * (uint64_t)h >= MAX_IMAGE_AREA) return WEBP_MUX_BAD_DATA;

  if (width != NULL) *width = w;
  if (height != NULL) *height = h;
  if (flags != NULL) *flags = f;
  return WEBP_MUX_OK;
}